

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O2

bool duckdb::DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<duckdb::hugeint_t>,false>
               (DecimalCastData<duckdb::hugeint_t> *state,int32_t exponent)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  hugeint_t mod;
  hugeint_t local_40;
  
  uVar4 = 0;
  uVar3 = (uint)state->decimal_count - (uint)state->scale;
  if (state->decimal_count <= state->scale) {
    uVar3 = uVar4;
  }
  if (exponent < 1) {
    if (exponent < 0) {
      state->exponent_type = NEGATIVE;
      uVar4 = exponent;
    }
  }
  else {
    state->exponent_type = POSITIVE;
    if (uVar3 - exponent == 0 || (int)uVar3 < exponent) {
      uVar4 = exponent - uVar3;
    }
    else {
      state->excessive_decimals = (uint8_t)(uVar3 - exponent);
    }
  }
  bVar1 = Finalize<duckdb::DecimalCastData<duckdb::hugeint_t>,false>(state);
  if (bVar1) {
    if ((int)uVar4 < 0) {
      lVar5 = (long)(int)uVar4 + -1;
      bVar2 = false;
      do {
        lVar5 = lVar5 + 1;
        if (lVar5 == 0) break;
        hugeint_t::hugeint_t(&local_40,10);
        mod = hugeint_t::operator%(&state->result,&local_40);
        hugeint_t::hugeint_t(&local_40,5);
        bVar2 = hugeint_t::operator>=(&mod,&local_40);
        hugeint_t::hugeint_t(&local_40,10);
        hugeint_t::operator/=(&state->result,&local_40);
        hugeint_t::hugeint_t(&local_40,0);
        bVar1 = hugeint_t::operator==(&state->result,&local_40);
      } while (!bVar1);
      bVar1 = true;
      if (bVar2 != false) {
        RoundUpResult<duckdb::DecimalCastData<duckdb::hugeint_t>,false>(state);
      }
    }
    else {
      lVar5 = (ulong)uVar4 + 1;
      do {
        lVar5 = lVar5 + -1;
        bVar1 = lVar5 == 0;
        if (bVar1) {
          return bVar1;
        }
        bVar2 = HandleDigit<duckdb::DecimalCastData<duckdb::hugeint_t>,false>(state,'\0');
      } while (bVar2);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool HandleExponent(T &state, int32_t exponent) {
		auto decimal_excess = (state.decimal_count > state.scale) ? state.decimal_count - state.scale : 0;
		if (exponent > 0) {
			state.exponent_type = ExponentType::POSITIVE;
			// Positive exponents need up to 'exponent' amount of digits
			// Everything beyond that amount needs to be truncated
			if (decimal_excess > exponent) {
				// We've allowed too many decimals
				state.excessive_decimals = UnsafeNumericCast<uint8_t>(decimal_excess - exponent);
				exponent = 0;
			} else {
				exponent -= decimal_excess;
			}
			D_ASSERT(exponent >= 0);
		} else if (exponent < 0) {
			state.exponent_type = ExponentType::NEGATIVE;
		}
		if (!Finalize<T, NEGATIVE>(state)) {
			return false;
		}
		if (exponent < 0) {
			bool round_up = false;
			for (idx_t i = 0; i < idx_t(-int64_t(exponent)); i++) {
				auto mod = state.result % 10;
				round_up = NEGATIVE ? mod <= -5 : mod >= 5;
				state.result /= 10;
				if (state.result == 0) {
					break;
				}
			}
			if (round_up) {
				RoundUpResult<T, NEGATIVE>(state);
			}
			return true;
		} else {
			// positive exponent: append 0's
			for (idx_t i = 0; i < idx_t(exponent); i++) {
				if (!HandleDigit<T, NEGATIVE>(state, 0)) {
					return false;
				}
			}
			return true;
		}
	}